

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O3

SERecurrentNode * __thiscall
spvtools::opt::SENodeSimplifyImpl::UpdateCoefficient
          (SENodeSimplifyImpl *this,SERecurrentNode *recurrent,int64_t coefficient_update)

{
  ScalarEvolutionAnalysis *pSVar1;
  Loop *pLVar2;
  int iVar3;
  SENode *pSVar4;
  SENode *pSVar5;
  SENode *pSVar6;
  __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
  _Var7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ChildContainerType *this_00;
  SENodeSimplifyImpl *pSVar8;
  SENode *local_50;
  ChildContainerType *local_48;
  SENodeSimplifyImpl *local_40;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_38;
  
  pSVar4 = (SENode *)operator_new(0x48);
  pSVar1 = (recurrent->super_SENode).parent_analysis_;
  pLVar2 = recurrent->loop_;
  local_48 = &pSVar4->children_;
  (pSVar4->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar4->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar4->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar4->parent_analysis_ = pSVar1;
  SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
  pSVar4->unique_id_ = SENode::NumberOfNodes;
  pSVar4->_vptr_SENode = (_func_int **)&PTR_GetType_00939cb8;
  pSVar4[1].children_.
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pLVar2;
  pSVar1 = this->analysis_;
  pSVar6 = recurrent->coefficient_;
  pSVar5 = ScalarEvolutionAnalysis::CreateConstant(pSVar1,coefficient_update);
  pSVar5 = ScalarEvolutionAnalysis::CreateMultiplyNode(pSVar1,pSVar6,pSVar5);
  local_40 = this;
  pSVar6 = ScalarEvolutionAnalysis::SimplifyExpression(this->analysis_,pSVar5);
  iVar3 = (**pSVar6->_vptr_SENode)(pSVar6);
  pSVar8 = local_40;
  this_00 = local_48;
  if (iVar3 == 6) {
    pSVar6 = pSVar5;
  }
  if (coefficient_update < 0) {
    pSVar5 = ScalarEvolutionAnalysis::CreateNegation(local_40->analysis_,recurrent->offset_);
    pSVar4[1].children_.
    super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pSVar5;
    local_50 = pSVar5;
    iVar3 = (*pSVar4->_vptr_SENode[4])(pSVar4);
    if (CONCAT44(extraout_var,iVar3) != 0) goto LAB_00604f09;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                      ((pSVar4->children_).
                       super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pSVar4->children_).
                       super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,pSVar5);
    std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
              (this_00,(const_iterator)_Var7._M_current,&local_50);
  }
  else {
    local_50 = recurrent->offset_;
    pSVar4[1].children_.
    super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_50;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                      (0,0);
    this_00 = local_48;
    std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
              (local_48,(const_iterator)_Var7._M_current,&local_50);
    pSVar8 = local_40;
  }
  pSVar4[1]._vptr_SENode = (_func_int **)pSVar6;
  local_50 = pSVar6;
  iVar3 = (*pSVar4->_vptr_SENode[4])(pSVar4);
  if (CONCAT44(extraout_var_00,iVar3) == 0) {
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                      ((pSVar4->children_).
                       super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pSVar4->children_).
                       super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,pSVar6);
    std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
              (this_00,(const_iterator)_Var7._M_current,&local_50);
    local_38._M_head_impl = pSVar4;
    pSVar6 = ScalarEvolutionAnalysis::GetCachedOrAdd
                       (pSVar8->analysis_,
                        (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                         *)&local_38);
    iVar3 = (*pSVar6->_vptr_SENode[6])(pSVar6);
    if (local_38._M_head_impl != (SENode *)0x0) {
      (*(local_38._M_head_impl)->_vptr_SENode[2])();
    }
    return (SERecurrentNode *)CONCAT44(extraout_var_01,iVar3);
  }
LAB_00604f09:
  __assert_fail("false && \"Trying to add a child node to a constant!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis_nodes.h"
                ,0x43,"virtual void spvtools::opt::SENode::AddChild(SENode *)");
}

Assistant:

SERecurrentNode* SENodeSimplifyImpl::UpdateCoefficient(
    SERecurrentNode* recurrent, int64_t coefficient_update) const {
  std::unique_ptr<SERecurrentNode> new_recurrent_node{new SERecurrentNode(
      recurrent->GetParentAnalysis(), recurrent->GetLoop())};

  SENode* new_coefficient = analysis_.CreateMultiplyNode(
      recurrent->GetCoefficient(),
      analysis_.CreateConstant(coefficient_update));

  // See if the node can be simplified.
  SENode* simplified = analysis_.SimplifyExpression(new_coefficient);
  if (simplified->GetType() != SENode::CanNotCompute)
    new_coefficient = simplified;

  if (coefficient_update < 0) {
    new_recurrent_node->AddOffset(
        analysis_.CreateNegation(recurrent->GetOffset()));
  } else {
    new_recurrent_node->AddOffset(recurrent->GetOffset());
  }

  new_recurrent_node->AddCoefficient(new_coefficient);

  return analysis_.GetCachedOrAdd(std::move(new_recurrent_node))
      ->AsSERecurrentNode();
}